

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O0

void __thiscall booster::shared_object::shared_object(shared_object *this,string *name)

{
  undefined1 uVar1;
  uint uVar2;
  data *this_00;
  undefined8 uVar3;
  char *in_RSI;
  runtime_error *in_RDI;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_ffffffffffffff38;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_10;
  
  this_01 = in_RDI;
  local_10 = in_RSI;
  noncopyable::noncopyable((noncopyable *)in_RDI);
  this_00 = (data *)operator_new(8);
  data::data(this_00);
  hold_ptr<booster::shared_object::data>::hold_ptr
            ((hold_ptr<booster::shared_object::data> *)this_01,this_00);
  __rhs = &local_40;
  std::__cxx11::string::string((string *)__rhs);
  uVar2 = open((shared_object *)in_RDI,local_10,(int)__rhs);
  uVar1 = (undefined1)uVar2;
  if ((uVar2 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff38),(char *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff38),__rhs);
    runtime_error::runtime_error(this_01,(string *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
    __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

shared_object::shared_object(std::string const &name) : d(new data())
	{
		std::string err;
		if(!open(name,err)) {
			throw booster::runtime_error("booster::shared_object: failed to load shared library " + name +": " + err);
		}
	}